

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O1

void I_ShutdownGraphics(void)

{
  uint32 *puVar1;
  DFrameBuffer *pDVar2;
  DFrameBuffer *s;
  
  pDVar2 = screen;
  if (screen != (DFrameBuffer *)0x0) {
    screen = (DFrameBuffer *)0x0;
    puVar1 = &(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
  }
  if (Video != (IVideo *)0x0) {
    (*Video->_vptr_IVideo[1])();
    Video = (IVideo *)0x0;
  }
  SDL_QuitSubSystem(0x20);
  return;
}

Assistant:

void I_ShutdownGraphics ()
{
	if (screen)
	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}
	if (Video)
		delete Video, Video = NULL;

	SDL_QuitSubSystem (SDL_INIT_VIDEO);
}